

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage.cpp
# Opt level: O0

void test_combinations<wchar_t,char>(void)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  int iVar4;
  conversion_error *anon_var_0;
  wchar_t *in_stack_fffffffffffffec8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffed0;
  allocator *paVar5;
  string *in_stack_fffffffffffffed8;
  string *s;
  undefined4 in_stack_fffffffffffffee0;
  method_type in_stack_fffffffffffffee4;
  uint uVar6;
  char *in_stack_fffffffffffffee8;
  allocator local_e9;
  string local_e8 [32];
  string local_c8;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [40];
  wstring local_78 [38];
  undefined1 local_52;
  allocator local_51;
  string local_50 [48];
  wstring local_20 [32];
  
  test_counter = test_counter + 1;
  utfutf<char,_1>::ok();
  booster::locale::conv::utf_to_utf<wchar_t,char>
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
  utfutf<wchar_t,_4>::ok();
  bVar1 = std::operator==(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  std::__cxx11::wstring::~wstring(local_20);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x12e);
    poVar2 = std::operator<<(poVar2," (utf_to_utf<CharOut,CharIn>(in::ok())==out::ok())");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    iVar4 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar1) {
      local_52 = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,"Error limits reached, stopping unit test",&local_51);
      booster::runtime_error::runtime_error
                ((runtime_error *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8);
      local_52 = 0;
      __cxa_throw(uVar3,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  utfutf<char,_1>::bad();
  booster::locale::conv::utf_to_utf<wchar_t,char>
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
  std::__cxx11::wstring::~wstring(local_78);
  poVar2 = std::operator<<((ostream *)&std::cerr,"Error in line:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x12f);
  poVar2 = std::operator<<(poVar2,
                           " (utf_to_utf<CharOut,CharIn>(in::bad(),booster::locale::conv::stop))");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if (error_counter < 0x15) {
    test_counter = test_counter + 1;
    error_counter = error_counter + 1;
    utfutf<char,_1>::bad();
    s = &local_c8;
    booster::locale::conv::utf_to_utf<wchar_t,char>
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
    utfutf<wchar_t,_4>::ok();
    bVar1 = std::operator==(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffee4);
    std::__cxx11::wstring::~wstring((wstring *)&local_c8);
    if ((uVar6 & 0x1000000) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x130);
      poVar2 = std::operator<<(poVar2," (utf_to_utf<CharOut,CharIn>(in::bad())==out::ok())");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      iVar4 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar4;
      if (bVar1) {
        uVar3 = __cxa_allocate_exception(0x30);
        paVar5 = &local_e9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e8,"Error limits reached, stopping unit test",paVar5);
        booster::runtime_error::runtime_error
                  ((runtime_error *)CONCAT44(uVar6,in_stack_fffffffffffffee0),s);
        __cxa_throw(uVar3,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    return;
  }
  local_a2 = 1;
  error_counter = error_counter + 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"Error limits reached, stopping unit test",&local_a1);
  booster::runtime_error::runtime_error
            ((runtime_error *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8);
  local_a2 = 0;
  __cxa_throw(uVar3,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void test_combinations()
{
    using booster::locale::conv::utf_to_utf;
    typedef utfutf<CharOut> out;
    typedef utfutf<CharIn> in;
    TEST( (utf_to_utf<CharOut,CharIn>(in::ok())==out::ok()) );
    TESTF( (utf_to_utf<CharOut,CharIn>(in::bad(),booster::locale::conv::stop)) );
    TEST( (utf_to_utf<CharOut,CharIn>(in::bad())==out::ok()) );
}